

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O0

_Bool duckdb_je_emap_split_prepare
                (tsdn_t *tsdn,emap_t *emap,emap_prepare_t *prepare,edata_t *edata,size_t size_a,
                edata_t *trail,size_t size_b)

{
  edata_t *in_RCX;
  long *in_RDX;
  rtree_leaf_elm_t **in_RDI;
  edata_t lead;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  uint8_t state;
  undefined1 in_stack_fffffffffffffd4e;
  undefined1 in_stack_fffffffffffffd4f;
  undefined1 in_stack_fffffffffffffd57;
  uint in_stack_fffffffffffffd5c;
  uint in_stack_fffffffffffffd64;
  uint in_stack_fffffffffffffd6c;
  edata_t *in_stack_fffffffffffffd70;
  uint64_t in_stack_fffffffffffffd80;
  extent_state_t in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8e;
  undefined1 in_stack_fffffffffffffd8f;
  edata_t *in_stack_fffffffffffffd90;
  rtree_ctx_t *in_stack_fffffffffffffd98;
  extent_pai_t in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  extent_head_state_t in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  rtree_ctx_t local_208;
  edata_t *local_78;
  long *local_70;
  _Bool local_51;
  rtree_ctx_t *local_50;
  rtree_ctx_t *local_40;
  undefined1 local_19;
  rtree_leaf_elm_t **in_stack_fffffffffffffff0;
  rtree_leaf_elm_t **in_stack_fffffffffffffff8;
  
  local_50 = &local_208;
  local_78 = in_RCX;
  local_70 = in_RDX;
  if (in_RDI == (rtree_leaf_elm_t **)0x0) {
    duckdb_je_rtree_ctx_data_init(local_50);
    local_40 = local_50;
  }
  else {
    local_19 = *(undefined1 *)(in_RDI + 0x67);
    local_40 = (rtree_ctx_t *)(in_RDI + 0x37);
    in_stack_fffffffffffffff0 = in_RDI;
    in_stack_fffffffffffffff8 = in_RDI;
  }
  memset(&stack0xfffffffffffffd70,0,0x80);
  edata_addr_get(local_78);
  edata_init(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
             (void *)((ulong)in_stack_fffffffffffffd64 << 0x20),
             (ulong)in_stack_fffffffffffffd5c << 0x20,(_Bool)in_stack_fffffffffffffd57,0,
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd88,(_Bool)in_stack_fffffffffffffd4f,
             (_Bool)in_stack_fffffffffffffd4e,in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
  emap_rtree_leaf_elms_lookup
            ((tsdn_t *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             (emap_t *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,(_Bool)in_stack_fffffffffffffd8f,
             (_Bool)in_stack_fffffffffffffd8e,in_stack_fffffffffffffff0,in_stack_fffffffffffffff8);
  emap_rtree_leaf_elms_lookup
            ((tsdn_t *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             (emap_t *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,(_Bool)in_stack_fffffffffffffd8f,
             (_Bool)in_stack_fffffffffffffd8e,in_stack_fffffffffffffff0,in_stack_fffffffffffffff8);
  if ((((*local_70 == 0) || (local_70[1] == 0)) || (local_70[2] == 0)) || (local_70[3] == 0)) {
    local_51 = true;
  }
  else {
    local_51 = false;
  }
  return local_51;
}

Assistant:

bool
emap_split_prepare(tsdn_t *tsdn, emap_t *emap, emap_prepare_t *prepare,
    edata_t *edata, size_t size_a, edata_t *trail, size_t size_b) {
	EMAP_DECLARE_RTREE_CTX;

	/*
	 * We use incorrect constants for things like arena ind, zero, ranged,
	 * and commit state, and head status.  This is a fake edata_t, used to
	 * facilitate a lookup.
	 */
	edata_t lead = {0};
	edata_init(&lead, 0U, edata_addr_get(edata), size_a, false, 0, 0,
	    extent_state_active, false, false, EXTENT_PAI_PAC, EXTENT_NOT_HEAD);

	emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx, &lead, false, true,
	    &prepare->lead_elm_a, &prepare->lead_elm_b);
	emap_rtree_leaf_elms_lookup(tsdn, emap, rtree_ctx, trail, false, true,
	    &prepare->trail_elm_a, &prepare->trail_elm_b);

	if (prepare->lead_elm_a == NULL || prepare->lead_elm_b == NULL
	    || prepare->trail_elm_a == NULL || prepare->trail_elm_b == NULL) {
		return true;
	}
	return false;
}